

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O2

Abc_Cex_t * Saig_RefManRunSat(Saig_RefMan_t *p,int fNewOrder)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *p_00;
  int *piVar3;
  int iVar4;
  int iVar5;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vVar2PiId;
  Vec_Int_t *vAssumps;
  void *pvVar6;
  Vec_Vec_t *pVVar7;
  Vec_Int_t *pVVar8;
  Abc_Cex_t *pAVar9;
  long lVar10;
  char *__s;
  int iVar11;
  Vec_Vec_t *local_38;
  
  Abc_Clock();
  if (p->pFrames->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p->pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0x203,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
  }
  pCnf = Cnf_DeriveSimple(p->pFrames,0);
  iVar4 = Saig_RefManSetPhases(p,(Abc_Cex_t *)0x0,0);
  if (iVar4 == 0) {
    Cnf_DataTranformPolarity(pCnf,0);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf,1,0);
    if (s != (sat_solver *)0x0) {
      if ((0 < p->nInputs) &&
         (iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0), iVar4 == -1)) {
        puts("The problem is trivially UNSAT. The CEX is real.");
        pAVar9 = Abc_CexDup(p->pCex,p->pCex->nRegs);
        memset(pAVar9 + 1,0,
               (long)(int)(((pAVar9->nBits >> 5) + 1) - (uint)((pAVar9->nBits & 0x1fU) == 0)) << 2);
        return pAVar9;
      }
      vVar2PiId = Vec_IntStartFull(pCnf->nVars);
      vAssumps = Vec_IntAlloc(p->pFrames->nObjs[2]);
      for (iVar4 = 0; p_00 = p->pFrames->vCis, iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
        pvVar6 = Vec_PtrEntry(p_00,iVar4);
        Vec_IntPush(vAssumps,pCnf->pVarNums[*(int *)((long)pvVar6 + 0x24)] * 2 + 1);
        Vec_IntWriteEntry(vVar2PiId,pCnf->pVarNums[*(int *)((long)pvVar6 + 0x24)],iVar4);
      }
      if (fNewOrder != 0) {
        pVVar7 = Saig_RefManOrderLiterals(p,vVar2PiId,vAssumps);
        local_38 = pVVar7;
        qsort(pVVar7->pArray,(long)pVVar7->nSize,8,Vec_VecSortCompare2);
        vAssumps->nSize = 0;
        for (iVar4 = 0; iVar11 = pVVar7->nSize, iVar4 < iVar11; iVar4 = iVar4 + 1) {
          for (iVar11 = 0; pVVar8 = Vec_VecEntryInt(pVVar7,iVar4), iVar11 < pVVar8->nSize;
              iVar11 = iVar11 + 1) {
            pVVar8 = Vec_VecEntryInt(pVVar7,iVar4);
            iVar5 = Vec_IntEntry(pVVar8,iVar11);
            Vec_IntPush(vAssumps,iVar5);
          }
        }
        for (iVar4 = 0; iVar4 < iVar11; iVar4 = iVar4 + 1) {
          pVVar8 = Vec_VecEntryInt(pVVar7,iVar4);
          printf("%d ",(ulong)(uint)pVVar8->nSize);
          iVar11 = pVVar7->nSize;
        }
        putchar(10);
        if (p->fVerbose != 0) {
          printf("Total PIs = %d. Essential PIs = %d.\n",
                 (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)pVVar7->nSize);
        }
      }
      Abc_Clock();
      uVar1 = vAssumps->nSize;
      iVar4 = sat_solver_solve(s,vAssumps->pArray,vAssumps->pArray + (int)uVar1,1000000,0,0,0);
      if (iVar4 != -1) {
        if (iVar4 == 1) {
          __s = "Internal Error!!! The resulting problem is SAT.";
        }
        else {
          __s = "Internal Error!!! SAT solver timed out.";
        }
        puts(__s);
        Cnf_DataFree(pCnf);
        sat_solver_delete(s);
        Vec_IntFree(vAssumps);
        Vec_IntFree(vVar2PiId);
        return (Abc_Cex_t *)0x0;
      }
      uVar2 = (s->conf_final).size;
      if ((long)(int)uVar2 < 1) {
        __assert_fail("nCoreLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                      ,0x25d,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
      }
      piVar3 = (s->conf_final).ptr;
      if (p->fVerbose != 0) {
        printf("AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n",(ulong)uVar2,
               (ulong)uVar1,(ulong)(uint)(s->stats).conflicts);
      }
      vAssumps->nSize = 0;
      for (lVar10 = 0; (int)uVar2 != lVar10; lVar10 = lVar10 + 1) {
        Vec_IntPush(vAssumps,piVar3[lVar10]);
      }
      pVVar7 = Saig_RefManOrderLiterals(p,vVar2PiId,vAssumps);
      vAssumps->nSize = 0;
      local_38 = pVVar7;
      for (iVar4 = 0; iVar4 < pVVar7->nSize; iVar4 = iVar4 + 1) {
        for (iVar11 = 0; pVVar8 = Vec_VecEntryInt(pVVar7,iVar4), iVar11 < pVVar8->nSize;
            iVar11 = iVar11 + 1) {
          pVVar8 = Vec_VecEntryInt(pVVar7,iVar4);
          iVar5 = Vec_IntEntry(pVVar8,iVar11);
          Vec_IntPush(vAssumps,iVar5);
        }
      }
      if (p->fVerbose != 0) {
        printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(p->pAig->nTruePis - p->nInputs)
              );
      }
      pAVar9 = Saig_RefManCreateCex(p,vVar2PiId,vAssumps);
      Cnf_DataFree(pCnf);
      sat_solver_delete(s);
      Vec_IntFree(vAssumps);
      Vec_IntFree(vVar2PiId);
      Vec_VecFreeP(&local_38);
      iVar4 = Saig_RefManSetPhases(p,pAVar9,0);
      if (iVar4 != 0) {
        puts("Reduced CEX verification has failed.");
      }
      iVar4 = Saig_RefManSetPhases(p,pAVar9,1);
      if (iVar4 != 0) {
        puts("Reduced CEX verification has failed.");
        return pAVar9;
      }
      return pAVar9;
    }
  }
  else {
    puts("Constructed frames are incorrect.");
  }
  Cnf_DataFree(pCnf);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Saig_RefManRunSat( Saig_RefMan_t * p, int fNewOrder )
{
    int nConfLimit = 1000000;
    Abc_Cex_t * pCare;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits = NULL;
    Vec_Int_t * vAssumps, * vVar2PiId;
    int i, k, Entry, RetValue;//, f = 0, Counter = 0;
    int nCoreLits, * pCoreLits;
    abctime clk = Abc_Clock();
    // create CNF
    assert( Aig_ManRegNum(p->pFrames) == 0 );
//    pCnf = Cnf_Derive( p->pFrames, 0 ); // too slow
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    RetValue = Saig_RefManSetPhases( p, NULL, 0 );
    if ( RetValue )
    {
        printf( "Constructed frames are incorrect.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    Cnf_DataTranformPolarity( pCnf, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
//Abc_PrintTime( 1, "Preparing", Abc_Clock() - clk );
    // look for a true counter-example
    if ( p->nInputs > 0 )
    {
        RetValue = sat_solver_solve( pSat, NULL, NULL, 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            printf( "The problem is trivially UNSAT. The CEX is real.\n" );
            // create counter-example
            pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
            memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
            return pCare;
        }
        // the problem is SAT - it is expected
    }
    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
//        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }

    // reverse the order of assumptions
//    if ( fNewOrder )
//    Vec_IntReverseOrder( vAssumps );

    if ( fNewOrder )
    {
        // create literals
        vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
        // sort literals
        Vec_VecSort( vLits, 1 );
        // save literals
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            Vec_IntPush( vAssumps, Entry );

        for ( i = 0; i < Vec_VecSize(vLits); i++ )
            printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
        printf( "\n" );

        if ( p->fVerbose )
            printf( "Total PIs = %d. Essential PIs = %d.\n", 
                Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
    }

    // solve
clk = Abc_Clock();
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//Abc_PrintTime( 1, "Solving", Abc_Clock() - clk );
    if ( RetValue != l_False )
    {
        if ( RetValue == l_True )
            printf( "Internal Error!!! The resulting problem is SAT.\n" );
        else
            printf( "Internal Error!!! SAT solver timed out.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Vec_IntFree( vAssumps );
        Vec_IntFree( vVar2PiId );
        return NULL;
    }
    assert( RetValue == l_False ); // UNSAT

    // get relevant SAT literals
    nCoreLits = sat_solver_final( pSat, &pCoreLits );
    assert( nCoreLits > 0 );
    if ( p->fVerbose )
    printf( "AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n", 
        nCoreLits, Vec_IntSize(vAssumps), (int)pSat->stats.conflicts );

    // save literals
    Vec_IntClear( vAssumps );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( vAssumps, pCoreLits[i] );


    // create literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    // sort literals
//    Vec_VecSort( vLits, 0 );
    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

//    for ( i = 0; i < Vec_VecSize(vLits); i++ )
//        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
//    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
/*
    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );

    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );
*/
    // create counter-example
    pCare = Saig_RefManCreateCex( p, vVar2PiId, vAssumps );

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    // verify counter-example
    RetValue = Saig_RefManSetPhases( p, pCare, 0 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    RetValue = Saig_RefManSetPhases( p, pCare, 1 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    return pCare;
}